

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::MacVerifyInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  CK_MECHANISM_TYPE CVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Session *this_00;
  Token *token;
  OSObject *key;
  CK_STATE sessionState;
  CK_RV CVar5;
  long lVar6;
  CryptoFactory *pCVar7;
  MacAlgorithm *inMacOp;
  SoftHSM *this_01;
  undefined4 extraout_var_01;
  size_t sVar8;
  undefined4 extraout_var_02;
  SoftHSM *this_02;
  ulong uVar9;
  long lStack_50;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pMechanism == (CK_MECHANISM_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar3 = Session::getOpType(this_00);
  if (iVar3 != 0) {
    return 0x90;
  }
  token = Session::getToken(this_00);
  if (token == (Token *)0x0) {
    return 5;
  }
  key = (OSObject *)HandleManager::getObject(this->handleManager,hKey);
  if (key == (OSObject *)0x0) {
    return 0x82;
  }
  iVar3 = (*key->_vptr_OSObject[10])(key);
  if ((char)iVar3 == '\0') {
    return 0x82;
  }
  iVar3 = (*key->_vptr_OSObject[4])(key,1,0);
  iVar4 = (*key->_vptr_OSObject[4])(key,2,1);
  sessionState = Session::getState(this_00);
  CVar5 = haveRead(sessionState,(CK_BBOOL)iVar3,(CK_BBOOL)iVar4);
  if (CVar5 != 0) {
    if (CVar5 == 0x101) {
      softHSMLog(6,"MacVerifyInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x134b,"User is not authorized");
      return 0x101;
    }
    return CVar5;
  }
  iVar3 = (*key->_vptr_OSObject[4])(key,0x10a,0);
  if ((char)iVar3 == '\0') {
    return 0x68;
  }
  bVar2 = isMechanismPermitted(this,key,pMechanism);
  if (!bVar2) {
    return 0x70;
  }
  iVar3 = (*key->_vptr_OSObject[5])(key,0x100,0x80000000);
  lVar6 = CONCAT44(extraout_var,iVar3);
  CVar1 = pMechanism->mechanism;
  if (CVar1 == 0x138) {
    if (lVar6 - 0x16U < 0xfffffffffffffffe) {
      return 99;
    }
    lStack_50 = 7;
  }
  else {
    if (CVar1 != 0x108a) {
      if (CVar1 == 0x221) {
        lStack_50 = 8;
        uVar9 = 0xa0;
        if ((lVar6 != 0x10) && (lVar6 != 0x28)) {
          return 99;
        }
      }
      else if (CVar1 == 0x251) {
        lStack_50 = 8;
        uVar9 = 0x100;
        if ((lVar6 != 0x10) && (lVar6 != 0x2b)) {
          return 99;
        }
      }
      else if (CVar1 == 0x256) {
        lStack_50 = 8;
        uVar9 = 0xe0;
        if ((lVar6 != 0x10) && (lVar6 != 0x2e)) {
          return 99;
        }
      }
      else if (CVar1 == 0x261) {
        lStack_50 = 8;
        uVar9 = 0x180;
        if ((lVar6 != 0x10) && (lVar6 != 0x2c)) {
          return 99;
        }
      }
      else if (CVar1 == 0x271) {
        lStack_50 = 8;
        uVar9 = 0x200;
        if ((lVar6 != 0x10) && (lVar6 != 0x2d)) {
          return 99;
        }
      }
      else {
        if (CVar1 != 0x211) {
          return 0x70;
        }
        lStack_50 = 8;
        if (lVar6 == 0x10) {
          uVar9 = 0x80;
        }
        else {
          uVar9 = 0x80;
          if (lVar6 != 0x27) {
            return 99;
          }
        }
      }
      goto LAB_00136ad1;
    }
    if (lVar6 != 0x1f) {
      return 99;
    }
    lStack_50 = 8;
  }
  uVar9 = 0;
LAB_00136ad1:
  pCVar7 = CryptoFactory::i();
  iVar3 = (*pCVar7->_vptr_CryptoFactory[6])(pCVar7);
  inMacOp = (MacAlgorithm *)CONCAT44(extraout_var_00,iVar3);
  if (inMacOp == (MacAlgorithm *)0x0) {
    return 0x70;
  }
  this_01 = (SoftHSM *)operator_new(0x38);
  this_02 = this_01;
  SymmetricKey::SymmetricKey((SymmetricKey *)this_01,0);
  CVar5 = getSymmetricKey(this_02,(SymmetricKey *)this_01,token,key);
  if (CVar5 != 0) {
    (*inMacOp->_vptr_MacAlgorithm[10])(inMacOp,this_01);
    pCVar7 = CryptoFactory::i();
    (*pCVar7->_vptr_CryptoFactory[7])(pCVar7,inMacOp);
    return 5;
  }
  iVar3 = (*((Serialisable *)&this_01->_vptr_SoftHSM)->_vptr_Serialisable[4])(this_01);
  sVar8 = ByteString::size((ByteString *)CONCAT44(extraout_var_01,iVar3));
  (*((Serialisable *)&this_01->_vptr_SoftHSM)->_vptr_Serialisable[6])(this_01,lStack_50 * sVar8);
  iVar3 = (*((Serialisable *)&this_01->_vptr_SoftHSM)->_vptr_Serialisable[7])(this_01);
  if (CONCAT44(extraout_var_02,iVar3) < uVar9) {
    (*inMacOp->_vptr_MacAlgorithm[10])(inMacOp,this_01);
    pCVar7 = CryptoFactory::i();
    (*pCVar7->_vptr_CryptoFactory[7])(pCVar7,inMacOp);
    return 0x62;
  }
  iVar3 = (*inMacOp->_vptr_MacAlgorithm[5])(inMacOp,this_01);
  if ((char)iVar3 == '\0') {
    (*inMacOp->_vptr_MacAlgorithm[10])(inMacOp,this_01);
    pCVar7 = CryptoFactory::i();
    (*pCVar7->_vptr_CryptoFactory[7])(pCVar7,inMacOp);
    return 0x70;
  }
  Session::setOpType(this_00,6);
  Session::setMacOp(this_00,inMacOp);
  Session::setAllowMultiPartOp(this_00,true);
  Session::setAllowSinglePartOp(this_00,true);
  Session::setSymmetricKey(this_00,(SymmetricKey *)this_01);
  return 0;
}

Assistant:

CK_RV SoftHSM::MacVerifyInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for verifying
	if (!key->getBooleanValue(CKA_VERIFY, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Get key info
	CK_KEY_TYPE keyType = key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED);

	// Get the MAC algorithm matching the mechanism
	// Also check mechanism constraints
	MacAlgo::Type algo = MacAlgo::Unknown;
	size_t bb = 8;
	size_t minSize = 0;
	switch(pMechanism->mechanism) {
#ifndef WITH_FIPS
		case CKM_MD5_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_MD5_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 16;
			algo = MacAlgo::HMAC_MD5;
			break;
#endif
		case CKM_SHA_1_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_SHA_1_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 20;
			algo = MacAlgo::HMAC_SHA1;
			break;
		case CKM_SHA224_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_SHA224_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 28;
			algo = MacAlgo::HMAC_SHA224;
			break;
		case CKM_SHA256_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_SHA256_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 32;
			algo = MacAlgo::HMAC_SHA256;
			break;
		case CKM_SHA384_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_SHA384_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 48;
			algo = MacAlgo::HMAC_SHA384;
			break;
		case CKM_SHA512_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_SHA512_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 64;
			algo = MacAlgo::HMAC_SHA512;
			break;
#ifdef WITH_GOST
		case CKM_GOSTR3411_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_GOST28147)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 32;
			algo = MacAlgo::HMAC_GOST;
			break;
#endif
		case CKM_DES3_CMAC:
			if (keyType != CKK_DES2 && keyType != CKK_DES3)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = MacAlgo::CMAC_DES;
			bb = 7;
			break;
		case CKM_AES_CMAC:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = MacAlgo::CMAC_AES;
			break;
		default:
			return CKR_MECHANISM_INVALID;
	}
	MacAlgorithm* mac = CryptoFactory::i()->getMacAlgorithm(algo);
	if (mac == NULL) return CKR_MECHANISM_INVALID;

	SymmetricKey* pubkey = new SymmetricKey();

	if (getSymmetricKey(pubkey, token, key) != CKR_OK)
	{
		mac->recycleKey(pubkey);
		CryptoFactory::i()->recycleMacAlgorithm(mac);
		return CKR_GENERAL_ERROR;
	}

	// Adjust key bit length
	pubkey->setBitLen(pubkey->getKeyBits().size() * bb);

	// Check key size
	if (pubkey->getBitLen() < (minSize*8))
	{
		mac->recycleKey(pubkey);
		CryptoFactory::i()->recycleMacAlgorithm(mac);
		return CKR_KEY_SIZE_RANGE;
	}

	// Initialize verifying
	if (!mac->verifyInit(pubkey))
	{
		mac->recycleKey(pubkey);
		CryptoFactory::i()->recycleMacAlgorithm(mac);
		return CKR_MECHANISM_INVALID;
	}

	session->setOpType(SESSION_OP_VERIFY);
	session->setMacOp(mac);
	session->setAllowMultiPartOp(true);
	session->setAllowSinglePartOp(true);
	session->setSymmetricKey(pubkey);

	return CKR_OK;
}